

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O0

StringRef * __thiscall axl::err::ErrorHdr::getDescription(ErrorHdr *this)

{
  StringRef *in_RDI;
  ErrorRef *in_stack_00000030;
  ErrorMgr *in_stack_00000038;
  ErrorHdr *in_stack_ffffffffffffff98;
  
  getErrorMgr();
  ErrorRef::ErrorRef((ErrorRef *)in_RDI,in_stack_ffffffffffffff98);
  ErrorMgr::getErrorDescription(in_stack_00000038,in_stack_00000030);
  ErrorRef::~ErrorRef((ErrorRef *)0x17b533);
  return in_RDI;
}

Assistant:

sl::StringRef
ErrorHdr::getDescription() const {
	return getErrorMgr()->getErrorDescription(this);
}